

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::
DisposableOwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
::disposeImpl(DisposableOwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
              *this,void *pointer)

{
  OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
  ::~OwnedBundle(&this->
                  super_OwnedBundle<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>
                );
  operator_delete(this,0x28);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override { delete this; }